

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_gej_var(secp256k1_ge *r,secp256k1_gej *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  uint64_t uVar223;
  uint64_t uVar224;
  uint64_t uVar225;
  ulong uVar226;
  ulong uVar227;
  ulong uVar228;
  ulong uVar229;
  ulong uVar230;
  ulong uVar231;
  ulong uVar232;
  ulong uVar233;
  ulong uVar234;
  ulong uVar235;
  ulong uVar236;
  
  if (a->infinity != 0) {
    r->infinity = 1;
    (r->x).n[0] = 0;
    (r->x).n[1] = 0;
    (r->x).n[2] = 0;
    (r->x).n[3] = 0;
    (r->x).n[4] = 0;
    (r->y).n[0] = 0;
    (r->y).n[1] = 0;
    (r->y).n[2] = 0;
    (r->y).n[3] = 0;
    (r->y).n[4] = 0;
    return;
  }
  r->infinity = 0;
  secp256k1_fe_impl_inv_var(&a->z,&a->z);
  uVar234 = (a->z).n[0];
  uVar1 = (a->z).n[1];
  uVar2 = (a->z).n[3];
  uVar227 = uVar234 * 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar2;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar227;
  uVar3 = (a->z).n[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar3;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar1 * 2;
  uVar4 = (a->z).n[4];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar4;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar4;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SUB168(auVar7 * auVar121,0);
  auVar5 = auVar8 * ZEXT816(0x1000003d10) + auVar6 * auVar120 + auVar5 * auVar119;
  uVar226 = uVar4 * 2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar226;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar234;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar2;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar1 * 2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar3;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SUB168(auVar7 * auVar121,8);
  auVar8 = auVar12 * ZEXT816(0x1000003d10000) +
           auVar9 * auVar122 + auVar11 * auVar124 + auVar10 * auVar123 + (auVar5 >> 0x34);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar234;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar234;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar226;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar2;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar3 * 2;
  auVar6 = auVar15 * auVar127 + auVar14 * auVar126 + (auVar8 >> 0x34);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar8._6_2_ & 0xf);
  auVar7 = auVar16 * ZEXT816(0x1000003d1) + auVar13 * auVar125;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar227;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar226;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar3;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar2;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar2;
  auVar6 = auVar18 * auVar129 + auVar19 * auVar130 + (auVar6 >> 0x34);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar9 = (auVar7 >> 0x34) + auVar17 * auVar128 + auVar20 * ZEXT816(0x1000003d10);
  uVar229 = auVar9._0_8_;
  uVar232 = auVar9._8_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar3;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar227;
  auVar209._8_8_ = uVar232 >> 0x34;
  auVar209._0_8_ = uVar232 * 0x1000 | uVar229 >> 0x34;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar1;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar226;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar2;
  auVar6 = auVar23 * auVar133 + (auVar6 >> 0x34);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = auVar6._0_8_;
  auVar209 = auVar21 * auVar131 + auVar22 * auVar132 + auVar24 * ZEXT816(0x1000003d10) + auVar209;
  auVar9 = auVar209 >> 0x34;
  auVar214._8_8_ = auVar9._8_8_;
  auVar214._0_8_ = auVar5._0_8_ & 0xffffffffffffe;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = auVar9._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar6._8_8_;
  auVar215 = auVar25 * ZEXT816(0x1000003d10000) + auVar214 + auVar215;
  uVar226 = auVar215._0_8_;
  uVar233 = (auVar215._8_8_ << 0xc | uVar226 >> 0x34) + (auVar8._0_8_ & 0xffffffffffff);
  uVar226 = uVar226 & 0xfffffffffffff;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar226;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar234;
  uVar236 = auVar209._0_8_ & 0xfffffffffffff;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar236;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar1;
  uVar229 = uVar229 & 0xfffffffffffff;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar229;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar3;
  uVar235 = auVar7._0_8_ & 0xfffffffffffff;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar235;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar233;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar4;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = SUB168(auVar30 * auVar138,0);
  auVar5 = auVar31 * ZEXT816(0x1000003d10) +
           auVar27 * auVar135 + auVar29 * auVar137 + auVar28 * auVar136 + auVar26 * auVar134;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar233;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar234;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar226;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar1;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar236;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar3;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar229;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar235;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar4;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = SUB168(auVar30 * auVar138,8);
  auVar6 = auVar37 * ZEXT816(0x1000003d10000) +
           auVar32 * auVar139 +
           auVar33 * auVar140 + auVar34 * auVar141 + auVar36 * auVar143 + auVar35 * auVar142 +
           (auVar5 >> 0x34);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar235;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar234;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar233;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar1;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar226;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar3;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar236;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar2;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar229;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar4;
  auVar7 = (auVar6 >> 0x34) +
           auVar39 * auVar145 + auVar42 * auVar148 + auVar41 * auVar147 + auVar40 * auVar146;
  uVar227 = auVar7._0_8_;
  uVar232 = auVar7._8_8_;
  auVar216._8_8_ = uVar232 >> 0x34;
  auVar216._0_8_ = uVar232 * 0x1000 | uVar227 >> 0x34;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar227 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar6._6_2_ & 0xf);
  auVar7 = auVar38 * auVar144 + auVar43 * ZEXT816(0x1000003d1);
  uVar228 = auVar7._0_8_;
  uVar227 = auVar7._8_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar229;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar234;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar235;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar1;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar233;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar3;
  auVar210._8_8_ = uVar227 >> 0x34;
  auVar210._0_8_ = uVar227 * 0x1000 | uVar228 >> 0x34;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar226;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar2;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar236;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar4;
  auVar216 = auVar46 * auVar151 + auVar48 * auVar153 + auVar47 * auVar152 + auVar216;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = auVar216._0_8_ & 0xfffffffffffff;
  auVar210 = auVar49 * ZEXT816(0x1000003d10) + auVar44 * auVar149 + auVar45 * auVar150 + auVar210;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar236;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar234;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar229;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar1;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar235;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar3;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar233;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar2;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar226;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar4;
  auVar7 = auVar54 * auVar158 + auVar53 * auVar157 + (auVar216 >> 0x34);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = auVar7._0_8_;
  auVar8 = auVar55 * ZEXT816(0x1000003d10) +
           auVar50 * auVar154 + auVar52 * auVar156 + auVar51 * auVar155 + (auVar210 >> 0x34);
  auVar9 = auVar8 >> 0x34;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = auVar9._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar7._8_8_;
  auVar217._8_8_ = auVar9._8_8_;
  auVar217._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
  auVar218 = auVar56 * ZEXT816(0x1000003d10000) + auVar217 + auVar218;
  uVar232 = auVar218._0_8_;
  uVar234 = (a->x).n[0];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar226;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar234;
  uVar1 = (a->x).n[1];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar236;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar1;
  uVar2 = (a->x).n[2];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar229;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar2;
  uVar3 = (a->x).n[3];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar235;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar3;
  uVar4 = (a->x).n[4];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar233;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar4;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = SUB168(auVar61 * auVar163,0);
  uVar230 = (auVar218._8_8_ << 0xc | uVar232 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff);
  auVar5 = auVar62 * ZEXT816(0x1000003d10) +
           auVar59 * auVar161 + auVar60 * auVar162 + auVar58 * auVar160 + auVar57 * auVar159;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar233;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar234;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar226;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar1;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar236;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar2;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar229;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar3;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar235;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar4;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = SUB168(auVar61 * auVar163,8);
  auVar6 = auVar68 * ZEXT816(0x1000003d10000) +
           auVar65 * auVar166 + auVar67 * auVar168 + auVar66 * auVar167 + auVar64 * auVar165 +
           auVar63 * auVar164 + (auVar5 >> 0x34);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar235;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar234;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar233;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar1;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar226;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar2;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar236;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar3;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar229;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar4;
  auVar7 = auVar73 * auVar173 + auVar72 * auVar172 + auVar71 * auVar171 + auVar70 * auVar170 +
           (auVar6 >> 0x34);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar9 = auVar74 * ZEXT816(0x1000003d1) + auVar69 * auVar169;
  uVar227 = auVar9._0_8_;
  uVar231 = auVar9._8_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar229;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar234;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar235;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar1;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar233;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar2;
  auVar211._8_8_ = uVar231 >> 0x34;
  auVar211._0_8_ = uVar231 * 0x1000 | uVar227 >> 0x34;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar226;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar3;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar236;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar4;
  auVar7 = auVar77 * auVar176 + auVar79 * auVar178 + auVar78 * auVar177 + (auVar7 >> 0x34);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar211 = auVar80 * ZEXT816(0x1000003d10) + auVar76 * auVar175 + auVar75 * auVar174 + auVar211;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar236;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar234;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar229;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar1;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar235;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar2;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar233;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar3;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar226;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar4;
  auVar7 = auVar85 * auVar183 + auVar84 * auVar182 + (auVar7 >> 0x34);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = auVar7._0_8_;
  auVar9 = auVar86 * ZEXT816(0x1000003d10) +
           auVar81 * auVar179 + auVar83 * auVar181 + auVar82 * auVar180 + (auVar211 >> 0x34);
  (a->x).n[0] = uVar227 & 0xfffffffffffff;
  auVar10 = auVar9 >> 0x34;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = auVar10._0_8_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = auVar7._8_8_;
  auVar219._8_8_ = auVar10._8_8_;
  auVar219._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
  (a->x).n[1] = auVar211._0_8_ & 0xfffffffffffff;
  auVar220 = auVar87 * ZEXT816(0x1000003d10000) + auVar219 + auVar220;
  uVar234 = auVar220._0_8_;
  (a->x).n[2] = auVar9._0_8_ & 0xfffffffffffff;
  (a->x).n[3] = uVar234 & 0xfffffffffffff;
  (a->x).n[4] = (auVar220._8_8_ << 0xc | uVar234 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff);
  uVar234 = (a->y).n[0];
  uVar232 = uVar232 & 0xfffffffffffff;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar232;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar234;
  uVar231 = auVar8._0_8_ & 0xfffffffffffff;
  uVar1 = (a->y).n[1];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar231;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar1;
  uVar229 = auVar210._0_8_ & 0xfffffffffffff;
  uVar2 = (a->y).n[2];
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar229;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar2;
  uVar228 = uVar228 & 0xfffffffffffff;
  uVar3 = (a->y).n[3];
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar228;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar3;
  uVar4 = (a->y).n[4];
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar230;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar4;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = SUB168(auVar92 * auVar188,0);
  auVar5 = auVar93 * ZEXT816(0x1000003d10) +
           auVar89 * auVar185 + auVar91 * auVar187 + auVar90 * auVar186 + auVar88 * auVar184;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar230;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar234;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar232;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar1;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar231;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar2;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar229;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar3;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar228;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar4;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = SUB168(auVar92 * auVar188,8);
  auVar6 = auVar99 * ZEXT816(0x1000003d10000) +
           auVar95 * auVar190 + auVar96 * auVar191 + auVar98 * auVar193 + auVar97 * auVar192 +
           auVar94 * auVar189 + (auVar5 >> 0x34);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar228;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar234;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar230;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar1;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar232;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar2;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar231;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar3;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar229;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar4;
  auVar7 = auVar104 * auVar198 + auVar103 * auVar197 + auVar102 * auVar196 + auVar101 * auVar195 +
           (auVar6 >> 0x34);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar8 = auVar105 * ZEXT816(0x1000003d1) + auVar100 * auVar194;
  uVar226 = auVar8._0_8_;
  uVar227 = auVar8._8_8_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar229;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar234;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar228;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar1;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar230;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar2;
  auVar212._8_8_ = uVar227 >> 0x34;
  auVar212._0_8_ = uVar227 * 0x1000 | uVar226 >> 0x34;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar232;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar3;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar231;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar4;
  auVar7 = (auVar7 >> 0x34) + auVar108 * auVar201 + auVar110 * auVar203 + auVar109 * auVar202;
  uVar233 = auVar7._0_8_;
  uVar227 = auVar7._8_8_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar233 & 0xfffffffffffff;
  auVar212 = auVar111 * ZEXT816(0x1000003d10) + auVar107 * auVar200 + auVar106 * auVar199 + auVar212
  ;
  auVar213._8_8_ = uVar227 >> 0x34;
  auVar213._0_8_ = uVar227 * 0x1000 | uVar233 >> 0x34;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar231;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar234;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar229;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar1;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar228;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar2;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar230;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar3;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar232;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar4;
  auVar213 = auVar116 * auVar208 + auVar115 * auVar207 + auVar213;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = auVar213._0_8_;
  auVar7 = auVar117 * ZEXT816(0x1000003d10) +
           auVar112 * auVar204 + auVar114 * auVar206 + auVar113 * auVar205 + (auVar212 >> 0x34);
  (a->y).n[0] = uVar226 & 0xfffffffffffff;
  auVar8 = auVar7 >> 0x34;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = auVar8._0_8_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = auVar213._8_8_;
  auVar221._8_8_ = auVar8._8_8_;
  auVar221._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
  (a->y).n[1] = auVar212._0_8_ & 0xfffffffffffff;
  auVar222 = auVar118 * ZEXT816(0x1000003d10000) + auVar221 + auVar222;
  uVar234 = auVar222._0_8_;
  (a->y).n[2] = auVar7._0_8_ & 0xfffffffffffff;
  (a->y).n[3] = uVar234 & 0xfffffffffffff;
  (a->y).n[4] = (auVar222._8_8_ << 0xc | uVar234 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff);
  (a->z).n[0] = 1;
  (a->z).n[3] = 0;
  (a->z).n[4] = 0;
  (a->z).n[1] = 0;
  (a->z).n[2] = 0;
  r->infinity = 0;
  uVar223 = (a->x).n[1];
  uVar224 = (a->x).n[2];
  uVar225 = (a->x).n[3];
  (r->x).n[0] = (a->x).n[0];
  (r->x).n[1] = uVar223;
  (r->x).n[2] = uVar224;
  (r->x).n[3] = uVar225;
  (r->x).n[4] = (a->x).n[4];
  uVar223 = (a->y).n[1];
  uVar224 = (a->y).n[2];
  uVar225 = (a->y).n[3];
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar223;
  (r->y).n[2] = uVar224;
  (r->y).n[3] = uVar225;
  (r->y).n[4] = (a->y).n[4];
  return;
}

Assistant:

static void secp256k1_ge_set_gej_var(secp256k1_ge *r, secp256k1_gej *a) {
    secp256k1_fe z2, z3;
    SECP256K1_GEJ_VERIFY(a);

    if (secp256k1_gej_is_infinity(a)) {
        secp256k1_ge_set_infinity(r);
        return;
    }
    r->infinity = 0;
    secp256k1_fe_inv_var(&a->z, &a->z);
    secp256k1_fe_sqr(&z2, &a->z);
    secp256k1_fe_mul(&z3, &a->z, &z2);
    secp256k1_fe_mul(&a->x, &a->x, &z2);
    secp256k1_fe_mul(&a->y, &a->y, &z3);
    secp256k1_fe_set_int(&a->z, 1);
    secp256k1_ge_set_xy(r, &a->x, &a->y);

    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(r);
}